

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O2

EventRegistry * __thiscall
license::FullLicenseInfo::validate
          (EventRegistry *__return_storage_ptr__,FullLicenseInfo *this,int sw_version)

{
  FUNCTION_RETURN FVar1;
  EVENT_TYPE EVar2;
  time_t tVar3;
  time_t tVar4;
  allocator local_49;
  PcSignature str_code;
  
  EventRegistry::EventRegistry(__return_storage_ptr__);
  os_initialize();
  printForSign_abi_cxx11_((string *)str_code,this);
  FVar1 = verifySignature((char *)str_code._0_8_,(this->license_signature)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)str_code);
  EVar2 = LICENSE_CORRUPTED;
  if (FVar1 == FUNC_RET_OK) {
    EVar2 = LICENSE_VERIFIED;
  }
  EventRegistry::addEvent(__return_storage_ptr__,EVar2,(uint)(FVar1 != FUNC_RET_OK) * 2);
  if (this->has_expiry == true) {
    tVar3 = time((time_t *)0x0);
    tVar4 = expires_on(this);
    if (tVar4 < tVar3) {
      std::__cxx11::string::string((string *)str_code,"",&local_49);
      EventRegistry::addEvent(__return_storage_ptr__,PRODUCT_EXPIRED,SVRT_ERROR,(string *)str_code);
      std::__cxx11::string::~string((string *)str_code);
    }
    tVar4 = valid_from(this);
    if (tVar3 < tVar4) {
      EventRegistry::addEvent(__return_storage_ptr__,PRODUCT_EXPIRED,SVRT_ERROR);
    }
  }
  if (this->has_client_sig == true) {
    strncpy(str_code,(this->client_signature)._M_dataplus._M_p,0x14);
    EVar2 = validate_pc_signature(str_code);
    if (EVar2 != LICENSE_OK) {
      EventRegistry::addEvent(__return_storage_ptr__,EVar2,SVRT_ERROR);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

EventRegistry FullLicenseInfo::validate(int sw_version) {
	EventRegistry er;
	os_initialize();
	FUNCTION_RETURN sigVer = verifySignature(printForSign().c_str(),
			license_signature.c_str());
	bool sigVerified = sigVer == FUNC_RET_OK;
	if (sigVerified) {
		er.addEvent(LICENSE_VERIFIED, SVRT_INFO);
	} else {
		er.addEvent(LICENSE_CORRUPTED, SVRT_ERROR);
	}
	if (has_expiry) {
		time_t now = time(NULL);
		if (expires_on() < now) {
			er.addEvent(PRODUCT_EXPIRED, SVRT_ERROR, "");
		}
		if (valid_from() > now) {
			er.addEvent(PRODUCT_EXPIRED, SVRT_ERROR);
		}
	}
	if (has_client_sig) {
		PcSignature str_code;
		strncpy(str_code, client_signature.c_str(), sizeof(str_code)-1);
		EVENT_TYPE event = validate_pc_signature(str_code);
		if (event != LICENSE_OK) {
			er.addEvent(event, SVRT_ERROR);
		}
	}
	return er;
}